

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestLog.hpp
# Opt level: O3

MessageBuilder * __thiscall tcu::MessageBuilder::operator<<(MessageBuilder *this,char **value)

{
  ostringstream *poVar1;
  char *__s;
  size_t sVar2;
  
  poVar1 = &this->m_str;
  __s = *value;
  if (__s == (char *)0x0) {
    std::ios::clear((int)poVar1 +
                    (int)(poVar1->super_basic_ostream<char,_std::char_traits<char>_>).
                         _vptr_basic_ostream[-3]);
  }
  else {
    sVar2 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>
              (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,__s,sVar2);
  }
  return this;
}

Assistant:

inline MessageBuilder& MessageBuilder::operator<< (const T& value)
{
	// Overload stream operator to implement custom format
	m_str << value;
	return *this;
}